

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy_test.cc
# Opt level: O2

void __thiscall
disruptor::test::MultiThreadedStrategy::HasAvailableCapacity::test_method
          (HasAvailableCapacity *this)

{
  MultiThreadedStrategy *this_00;
  atomic<long> *paVar1;
  long lVar2;
  bool bVar3;
  ulong local_1e8;
  undefined **local_1e0;
  undefined1 local_1d8;
  undefined8 *local_1d0;
  char *local_1c8;
  int64_t local_1c0;
  int64_t return_value;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> one_dependents;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  Sequence cursor;
  
  ClaimStrategyFixture<disruptor::MultiThreadedStrategy>::oneDependents
            (&one_dependents,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE);
  cursor.sequence_.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy;
  return_value = disruptor::MultiThreadedStrategy::IncrementAndGet
                           (this_00,&cursor,&one_dependents,8);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x91);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_0010eaa8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_d0 = "";
  local_1c0 = 7;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_1e0,&local_d8,0x91,1,2,&return_value,"return_value",&local_1c0,
             "kInitialCursorValue + 8");
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x93);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_0010eaa8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_160 = "";
  bVar3 = disruptor::MultiThreadedStrategy::HasAvailableCapacity
                    (this_00,&one_dependents,
                     (int64_t)cursor.sequence_.super___atomic_base<long>._M_i,1);
  local_1e8 = local_1e8 & 0xffffffffffffff00;
  local_1c0._0_1_ = bVar3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_1e0,&local_168,0x93,1,2,&local_1c0,
             "strategy.HasAvailableCapacity(one_dependents, cursor.sequence())",&local_1e8,"false");
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_1.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x98);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_0010eaa8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_170 = "";
  bVar3 = disruptor::MultiThreadedStrategy::HasAvailableCapacity
                    (this_00,&one_dependents,
                     (int64_t)cursor.sequence_.super___atomic_base<long>._M_i,1);
  local_1c0 = CONCAT71(local_1c0._1_7_,bVar3);
  local_1e8 = CONCAT71(local_1e8._1_7_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_1e0,&local_178,0x98,1,2,&local_1c0,
             "strategy.HasAvailableCapacity(one_dependents, cursor.sequence())",&local_1e8,"true");
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x9c);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_0010eaa8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_180 = "";
  local_1c0 = disruptor::MultiThreadedStrategy::IncrementAndGet(this_00,&cursor,&one_dependents,1);
  local_1e8 = return_value + 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_1e0,&local_188,0x9c,1,2,&local_1c0,
             "strategy.IncrementAndGet(cursor, one_dependents)",&local_1e8,"return_value + 1L");
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_1.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 8;
  UNLOCK();
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0xa4);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_0010eaa8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_190 = "";
  local_1c0 = disruptor::MultiThreadedStrategy::IncrementAndGet(this_00,&cursor,&one_dependents,8);
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).sequence_1.sequence_;
  lVar2 = (paVar1->super___atomic_base<long>)._M_i;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 8;
  UNLOCK();
  local_1e8 = lVar2 + 8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_1e0,&local_198,0xa4,1,2,&local_1c0,
             "strategy.IncrementAndGet(cursor, one_dependents, 8)",&local_1e8,
             "sequence_1.IncrementAndGet(8)");
  std::_Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~_Vector_base
            (&one_dependents.
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(HasAvailableCapacity) {
  auto one_dependents = oneDependents();
  Sequence cursor;

  int64_t return_value =
      strategy.IncrementAndGet(cursor, one_dependents, RING_BUFFER_SIZE);
  BOOST_CHECK_EQUAL(return_value, kInitialCursorValue + RING_BUFFER_SIZE);
  BOOST_CHECK_EQUAL(
      strategy.HasAvailableCapacity(one_dependents, cursor.sequence()), false);

  // advance late consumers
  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(
      strategy.HasAvailableCapacity(one_dependents, cursor.sequence()), true);

  // only one slot free
  BOOST_CHECK_EQUAL(strategy.IncrementAndGet(cursor, one_dependents),
                    return_value + 1L);

  // dependent keeps up
  sequence_1.IncrementAndGet(RING_BUFFER_SIZE);

  // all equals
  BOOST_CHECK_EQUAL(
      strategy.IncrementAndGet(cursor, one_dependents, RING_BUFFER_SIZE),
      sequence_1.IncrementAndGet(RING_BUFFER_SIZE));
}